

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v64_intrinsics_c.h
# Opt level: O1

c_v64 c_v64_madd_us8(c_v64 a,c_v64 b)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  
  uVar1 = (int)b.s8[1] * ((uint)((ulong)a >> 8) & 0xff) + (int)b.s8[0] * (a.u32[0] & 0xff);
  if ((int)uVar1 < -0x7fff) {
    uVar1 = 0xffff8000;
  }
  if (0x7ffe < (int)uVar1) {
    uVar1 = 0x7fff;
  }
  iVar2 = (b.s32[0] >> 0x18) * ((uint)((ulong)a >> 0x18) & 0xff) +
          (int)b.s8[2] * ((uint)((ulong)a >> 0x10) & 0xff);
  if (iVar2 < -0x7fff) {
    iVar2 = -0x8000;
  }
  if (0x7ffe < iVar2) {
    iVar2 = 0x7fff;
  }
  uVar4 = ((int)((ulong)b >> 0x10) >> 0x18) * (a.u32[1] >> 8 & 0xff) +
          ((int)((ulong)b >> 8) >> 0x18) * (a.u32[1] & 0xff);
  if ((int)uVar4 < -0x7fff) {
    uVar4 = 0xffff8000;
  }
  if (0x7ffe < (int)uVar4) {
    uVar4 = 0x7fff;
  }
  uVar3 = ((int)((ulong)b >> 0x18) >> 0x18) * (a.u16[3] & 0xff) + (b.s32[1] >> 0x18) * (uint)a.u8[7]
  ;
  if ((int)uVar3 < -0x7fff) {
    uVar3 = 0xffff8000;
  }
  if (0x7ffe < (int)uVar3) {
    uVar3 = 0x7fff;
  }
  return (c_v64)((ulong)(uVar1 & 0xffff) |
                (ulong)(uint)(iVar2 << 0x10) |
                (ulong)(uVar4 & 0xffff) << 0x20 | (ulong)uVar3 << 0x30);
}

Assistant:

SIMD_INLINE c_v64 c_v64_madd_us8(c_v64 a, c_v64 b) {
  c_v64 t;
  int32_t u;
  u = a.u8[0] * b.s8[0] + a.u8[1] * b.s8[1];
  t.s16[0] = SIMD_CLAMP(u, -32768, 32767);
  u = a.u8[2] * b.s8[2] + a.u8[3] * b.s8[3];
  t.s16[1] = SIMD_CLAMP(u, -32768, 32767);
  u = a.u8[4] * b.s8[4] + a.u8[5] * b.s8[5];
  t.s16[2] = SIMD_CLAMP(u, -32768, 32767);
  u = a.u8[6] * b.s8[6] + a.u8[7] * b.s8[7];
  t.s16[3] = SIMD_CLAMP(u, -32768, 32767);
  return t;
}